

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod_inv.c
# Opt level: O3

int32 mod_inv_read_tmat(model_inventory_t *minv,char *fn,float32 floor)

{
  uint32 uVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  uint32 uVar5;
  uint32 dim;
  ulong uVar6;
  ulong uVar7;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***tmat;
  uint32 local_2c;
  uint local_28;
  float local_24;
  float32 ***local_20;
  
  local_24 = (float)floor;
  iVar2 = s3tmat_read(fn,&local_20,&local_28,&local_2c);
  iVar4 = -1;
  if (iVar2 == 0) {
    if ((local_24 != 0.0) || (uVar3 = local_28, uVar5 = local_2c, NAN(local_24))) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/mod_inv.c"
              ,0x12d,"inserting tprob floor %e and renormalizing\n",(double)local_24);
      uVar5 = local_2c;
      if (local_28 == 0) {
        uVar3 = 0;
      }
      else {
        uVar6 = 0;
        uVar3 = local_28;
        dim = local_2c;
        do {
          uVar1 = 1;
          if (dim != 1) {
            uVar7 = 0;
            do {
              vector_normalize((vector_t)local_20[uVar6][uVar7],dim);
              vector_nz_floor((vector_t)local_20[uVar6][uVar7],local_2c,(float32)local_24);
              vector_normalize((vector_t)local_20[uVar6][uVar7],local_2c);
              uVar7 = uVar7 + 1;
              uVar3 = local_28;
              uVar5 = local_2c;
              dim = local_2c;
              uVar1 = local_2c;
            } while (uVar7 < local_2c - 1);
          }
          dim = uVar1;
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar3);
      }
    }
    minv->tmat = local_20;
    minv->n_tmat = uVar3;
    minv->n_state_pm = uVar5;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int32
mod_inv_read_tmat(model_inventory_t *minv,
		  const char *fn,
		  float32 floor)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j;

    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    if (floor != 0) {
	E_INFO("inserting tprob floor %e and renormalizing\n",
	       floor);
    
	for (i = 0; i < n_tmat; i++) {
	    for (j = 0; j < n_state_pm-1; j++) {
		vector_normalize(tmat[i][j], n_state_pm);
		vector_nz_floor(tmat[i][j], n_state_pm, floor);
		vector_normalize(tmat[i][j], n_state_pm);
	    }
	}
    }

    minv->tmat = tmat;
    minv->n_tmat = n_tmat;
    minv->n_state_pm = n_state_pm;

    return S3_SUCCESS;
}